

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O1

void __thiscall TcpSocket::TcpSocket(TcpSocket *this,addrinfo *host)

{
  int iVar1;
  int enable;
  stringstream stream;
  undefined4 local_1bc;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  Socket::Socket(&this->super_Socket,host,1);
  local_1bc = 0;
  iVar1 = setsockopt((this->super_Socket).m_Socket,6,1,&local_1bc,4);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>(local_188,"Enabling TCP_NODELAY failed",0x1b)
    ;
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
    std::ios_base::~ios_base(local_118);
  }
  return;
}

Assistant:

TcpSocket::TcpSocket(const struct addrinfo* const host)
    : Socket(host, SOCK_STREAM)
{
    // AdsDll.lib seems to use TCP_NODELAY, we use it to be compatible
    const int enable = 0;
    if (setsockopt(m_Socket, IPPROTO_TCP, TCP_NODELAY, (const char*)&enable, sizeof(enable))) {
        LOG_WARN("Enabling TCP_NODELAY failed");
    }
}